

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint8_t mipsdsp_rnd8_rashift(uint8_t a,uint8_t s)

{
  undefined4 local_10;
  uint32_t temp;
  uint8_t s_local;
  uint8_t a_local;
  
  if (s == '\0') {
    local_10 = (uint)a << 1;
  }
  else {
    local_10 = (int)(char)a >> (s - 1 & 0x1f);
  }
  return (uint8_t)(local_10 + 1U >> 1);
}

Assistant:

static inline uint8_t mipsdsp_rnd8_rashift(uint8_t a, uint8_t s)
{
    uint32_t temp;

    if (s == 0) {
        temp = (uint32_t)a << 1;
    } else {
        temp = (int32_t)(int8_t)a >> (s - 1);
    }

    return (temp + 1) >> 1;
}